

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_sub(lua_State *L)

{
  char *s_00;
  lua_Integer lVar1;
  size_t len;
  lua_State *plVar2;
  ptrdiff_t end;
  ptrdiff_t start;
  char *s;
  size_t l;
  undefined8 in_stack_ffffffffffffffd8;
  lua_State *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  lua_State *in_stack_fffffffffffffff0;
  
  s_00 = luaL_checklstring(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20)
                           ,(size_t *)in_stack_ffffffffffffffe0);
  lVar1 = luaL_checkinteger(in_stack_ffffffffffffffe0,
                            (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  len = posrelat(lVar1,(size_t)in_stack_fffffffffffffff0);
  lVar1 = luaL_optinteger(in_stack_fffffffffffffff0,(int)((ulong)s_00 >> 0x20),len);
  plVar2 = (lua_State *)posrelat(lVar1,(size_t)in_stack_fffffffffffffff0);
  if ((long)len < 1) {
    len = 1;
  }
  if ((long)in_stack_fffffffffffffff0 < (long)plVar2) {
    plVar2 = in_stack_fffffffffffffff0;
  }
  if ((long)plVar2 < (long)len) {
    lua_pushlstring(in_stack_fffffffffffffff0,s_00,len);
  }
  else {
    lua_pushlstring(in_stack_fffffffffffffff0,s_00,len);
  }
  return 1;
}

Assistant:

static int str_sub(lua_State*L){
size_t l;
const char*s=luaL_checklstring(L,1,&l);
ptrdiff_t start=posrelat(luaL_checkinteger(L,2),l);
ptrdiff_t end=posrelat(luaL_optinteger(L,3,-1),l);
if(start<1)start=1;
if(end>(ptrdiff_t)l)end=(ptrdiff_t)l;
if(start<=end)
lua_pushlstring(L,s+start-1,end-start+1);
else lua_pushliteral(L,"");
return 1;
}